

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbolize.cc
# Opt level: O0

void __thiscall
google::anon_unknown_0::LineReader::LineReader
          (LineReader *this,int fd,char *buf,size_t buf_len,size_t offset)

{
  size_t offset_local;
  size_t buf_len_local;
  char *buf_local;
  int fd_local;
  LineReader *this_local;
  
  this->fd_ = fd;
  this->buf_ = buf;
  this->buf_len_ = buf_len;
  this->offset_ = offset;
  this->bol_ = buf;
  this->eol_ = buf;
  this->eod_ = buf;
  return;
}

Assistant:

explicit LineReader(int fd, char* buf, size_t buf_len, size_t offset)
      : fd_(fd),
        buf_(buf),
        buf_len_(buf_len),
        offset_(offset),
        bol_(buf),
        eol_(buf),
        eod_(buf) {}